

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

drmp3_bool32
drmp3_bind_seek_table(drmp3 *pMP3,drmp3_uint32 seekPointCount,drmp3_seek_point *pSeekPoints)

{
  drmp3_seek_point *pSeekPoints_local;
  drmp3_uint32 seekPointCount_local;
  drmp3 *pMP3_local;
  drmp3_bool32 local_4;
  
  if (pMP3 == (drmp3 *)0x0) {
    local_4 = 0;
  }
  else {
    if ((seekPointCount == 0) || (pSeekPoints == (drmp3_seek_point *)0x0)) {
      pMP3->seekPointCount = 0;
      pMP3->pSeekPoints = (drmp3_seek_point *)0x0;
    }
    else {
      pMP3->seekPointCount = seekPointCount;
      pMP3->pSeekPoints = pSeekPoints;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

drmp3_bool32 drmp3_bind_seek_table(drmp3* pMP3, drmp3_uint32 seekPointCount, drmp3_seek_point* pSeekPoints)
{
    if (pMP3 == NULL) {
        return DRMP3_FALSE;
    }

    if (seekPointCount == 0 || pSeekPoints == NULL) {
        // Unbinding.
        pMP3->seekPointCount = 0;
        pMP3->pSeekPoints = NULL;
    } else {
        // Binding.
        pMP3->seekPointCount = seekPointCount;
        pMP3->pSeekPoints = pSeekPoints;
    }

    return DRMP3_TRUE;
}